

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HL1MDLLoader.cpp
# Opt level: O2

void __thiscall
Assimp::MDL::HalfLife::HL1MDLLoader::extract_anim_value
          (HL1MDLLoader *this,AnimValue_HL1 *panimvalue,int frame,float bone_scale,float *value)

{
  uint8_t *puVar1;
  int k;
  ulong uVar2;
  
  while( true ) {
    puVar1 = &(panimvalue->num).total;
    if (frame < (int)(uint)*puVar1) break;
    panimvalue = panimvalue + (ulong)(panimvalue->num).valid + 1;
    frame = frame - (uint)*puVar1;
  }
  uVar2 = (long)(frame + 1);
  if ((int)(uint)(panimvalue->num).valid <= frame) {
    uVar2 = (ulong)(panimvalue->num).valid;
  }
  *value = (float)(int)panimvalue[uVar2].value * bone_scale;
  return;
}

Assistant:

void HL1MDLLoader::extract_anim_value(
        const AnimValue_HL1 *panimvalue,
        int frame, float bone_scale, float &value) {
    int k = frame;

    // find span of values that includes the frame we want
    while (panimvalue->num.total <= k) {
        k -= panimvalue->num.total;
        panimvalue += panimvalue->num.valid + 1;
    }

    // Bah, missing blend!
    if (panimvalue->num.valid > k)
        value = panimvalue[k + 1].value * bone_scale;
    else
        value = panimvalue[panimvalue->num.valid].value * bone_scale;
}